

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O1

void __thiscall HEVCStreamReader::~HEVCStreamReader(HEVCStreamReader *this)

{
  HevcSpsUnit *pHVar1;
  pointer puVar2;
  pointer puVar3;
  uint8_t *puVar4;
  
  if (this->m_vps != (HevcVpsUnit *)0x0) {
    operator_delete(this->m_vps,0x50);
  }
  pHVar1 = this->m_sps;
  if (pHVar1 != (HevcSpsUnit *)0x0) {
    puVar2 = (pHVar1->num_delta_pocs).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)(pHVar1->num_delta_pocs).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2)
      ;
    }
    operator_delete(pHVar1,0xa0);
  }
  if (this->m_pps != (HevcPpsUnit *)0x0) {
    operator_delete(this->m_pps,0x48);
  }
  if (this->m_hdr != (HevcHdrUnit *)0x0) {
    operator_delete(this->m_hdr,0x40);
  }
  if (this->m_slice != (HevcSliceHeader *)0x0) {
    operator_delete(this->m_slice,0x48);
  }
  puVar3 = (this->m_ppsBuffer).m_data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->m_ppsBuffer).m_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  puVar3 = (this->m_spsBuffer).m_data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->m_spsBuffer).m_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  puVar3 = (this->m_vpsBuffer).m_data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->m_vpsBuffer).m_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  (this->super_MPEGStreamReader).super_AbstractStreamReader.super_BaseAbstractStreamReader.
  _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__MPEGStreamReader_00241d88;
  puVar4 = (this->super_MPEGStreamReader).m_tmpBuffer;
  if (puVar4 != (uint8_t *)0x0) {
    operator_delete__(puVar4);
    return;
  }
  return;
}

Assistant:

HEVCStreamReader::~HEVCStreamReader()
{
    delete m_vps;
    delete m_sps;
    delete m_pps;
    delete m_hdr;
    delete m_slice;
}